

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void NotifyCallback(AmsAddr *pAddr,AdsNotificationHeader *pNotification,uint32_t hUser)

{
  long lVar1;
  long lVar2;
  undefined1 uVar3;
  int iVar4;
  undefined8 in_RAX;
  ostream *poVar5;
  undefined4 in_register_00000014;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  if (NotifyCallback(AmsAddr_const*,AdsNotificationHeader_const*,unsigned_int)::notificationOutput
      == '\0') {
    iVar4 = __cxa_guard_acquire(&NotifyCallback(AmsAddr_const*,AdsNotificationHeader_const*,unsigned_int)
                                 ::notificationOutput,pNotification,
                                CONCAT44(in_register_00000014,hUser));
    if (iVar4 != 0) {
      std::ostream::ostream
                (&NotifyCallback(AmsAddr_const*,AdsNotificationHeader_const*,unsigned_int)::
                  notificationOutput,(streambuf *)0x0);
      __cxa_atexit(std::ostream::~ostream,
                   &NotifyCallback(AmsAddr_const*,AdsNotificationHeader_const*,unsigned_int)::
                    notificationOutput,&__dso_handle);
      __cxa_guard_release(&NotifyCallback(AmsAddr_const*,AdsNotificationHeader_const*,unsigned_int)
                           ::notificationOutput);
    }
  }
  g_NumNotifications = g_NumNotifications + 1;
  lVar1 = *(long *)(NotifyCallback(AmsAddr_const*,AdsNotificationHeader_const*,unsigned_int)::
                    notificationOutput + -0x18);
  if ((&DAT_0011f439)[lVar1] == '\0') {
    uVar3 = std::ios::widen((char)lVar1 + 'X');
    (&DAT_0011f438)[lVar1] = uVar3;
    (&DAT_0011f439)[lVar1] = 1;
  }
  (&DAT_0011f438)[lVar1] = 0x30;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             &NotifyCallback(AmsAddr_const*,AdsNotificationHeader_const*,unsigned_int)::
              notificationOutput,"NetId 0x",8);
  poVar5 = (ostream *)
           operator<<((ostream *)
                      &NotifyCallback(AmsAddr_const*,AdsNotificationHeader_const*,unsigned_int)::
                       notificationOutput,&pAddr->netId);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"hUser 0x",8);
  lVar1 = *(long *)poVar5;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffffb5 | 8;
  *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," sample time: ",0xe);
  *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," sample size: ",0xe);
  *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," value: 0x",10);
  *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)(byte)pNotification[1].nTimeStamp);
  uStack_28 = CONCAT17(10,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)((long)&uStack_28 + 7),1);
  return;
}

Assistant:

static void NotifyCallback(const AmsAddr* pAddr, const AdsNotificationHeader* pNotification, uint32_t hUser)
{
#if 0
    static std::ostream& notificationOutput = std::cout;
#else
    static std::ostream notificationOutput(0);
#endif
    ++g_NumNotifications;
    auto pData = reinterpret_cast<const uint8_t*>(pNotification + 1);
    notificationOutput << std::setfill('0') <<
        "NetId 0x" << pAddr->netId <<
        "hUser 0x" << std::hex << std::setw(4) << hUser <<
        " sample time: " << std::dec << pNotification->nTimeStamp <<
        " sample size: " << std::dec << pNotification->cbSampleSize <<
        " value: 0x" << std::hex << (int)pData[0] << '\n';
}